

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O2

void __thiscall
duckdb::SerializeNumericStatsValue
          (duckdb *this,LogicalType *type,NumericValueUnion val,bool has_value,
          Serializer *serializer)

{
  duckdb dVar1;
  Serializer *this_00;
  InternalException *this_01;
  undefined7 in_register_00000081;
  allocator local_52;
  bool has_value_local;
  NumericValueUnion val_local;
  string local_40;
  
  val_local.value_.hugeint.upper = val.value_.bigint;
  this_00 = (Serializer *)CONCAT71(in_register_00000081,has_value);
  has_value_local = val.value_._8_1_;
  val_local.value_.bigint = (int64_t)type;
  Serializer::WriteProperty<bool>
            ((Serializer *)CONCAT71(in_register_00000081,has_value),100,"has_value",&has_value_local
            );
  if (has_value_local == true) {
    dVar1 = this[1];
    switch(dVar1) {
    case (duckdb)0x1:
      Serializer::WriteProperty<bool>(this_00,0x65,"value",(bool *)&val_local);
      break;
    case (duckdb)0x2:
      Serializer::WriteProperty<unsigned_char>(this_00,0x65,"value",(uchar *)&val_local);
      break;
    case (duckdb)0x3:
      Serializer::WriteProperty<signed_char>(this_00,0x65,"value",(char *)&val_local);
      break;
    case (duckdb)0x4:
      Serializer::WriteProperty<unsigned_short>(this_00,0x65,"value",(unsigned_short *)&val_local);
      break;
    case (duckdb)0x5:
      Serializer::WriteProperty<short>(this_00,0x65,"value",(short *)&val_local);
      break;
    case (duckdb)0x6:
      Serializer::WriteProperty<unsigned_int>(this_00,0x65,"value",(uint *)&val_local);
      break;
    case (duckdb)0x7:
      Serializer::WriteProperty<int>(this_00,0x65,"value",(int *)&val_local);
      break;
    case (duckdb)0x8:
      Serializer::WriteProperty<unsigned_long>(this_00,0x65,"value",(unsigned_long *)&val_local);
      break;
    case (duckdb)0x9:
      Serializer::WriteProperty<long>(this_00,0x65,"value",(long *)&val_local);
      break;
    case (duckdb)0xa:
switchD_005146c1_caseD_a:
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_40,"Unsupported type for serializing numeric statistics",&local_52
                );
      InternalException::InternalException(this_01,&local_40);
      __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    case (duckdb)0xb:
      Serializer::WriteProperty<float>(this_00,0x65,"value",(float *)&val_local);
      break;
    case (duckdb)0xc:
      Serializer::WriteProperty<double>(this_00,0x65,"value",(double *)&val_local);
      break;
    default:
      if (dVar1 == (duckdb)0xcb) {
        Serializer::WriteProperty<duckdb::uhugeint_t>(this_00,0x65,"value",(uhugeint_t *)&val_local)
        ;
      }
      else {
        if (dVar1 != (duckdb)0xcc) goto switchD_005146c1_caseD_a;
        Serializer::WriteProperty<duckdb::hugeint_t>(this_00,0x65,"value",(hugeint_t *)&val_local);
      }
    }
  }
  return;
}

Assistant:

static void SerializeNumericStatsValue(const LogicalType &type, NumericValueUnion val, bool has_value,
                                       Serializer &serializer) {
	serializer.WriteProperty(100, "has_value", has_value);
	if (!has_value) {
		return;
	}
	switch (type.InternalType()) {
	case PhysicalType::BOOL:
		serializer.WriteProperty(101, "value", val.value_.boolean);
		break;
	case PhysicalType::INT8:
		serializer.WriteProperty(101, "value", val.value_.tinyint);
		break;
	case PhysicalType::INT16:
		serializer.WriteProperty(101, "value", val.value_.smallint);
		break;
	case PhysicalType::INT32:
		serializer.WriteProperty(101, "value", val.value_.integer);
		break;
	case PhysicalType::INT64:
		serializer.WriteProperty(101, "value", val.value_.bigint);
		break;
	case PhysicalType::UINT8:
		serializer.WriteProperty(101, "value", val.value_.utinyint);
		break;
	case PhysicalType::UINT16:
		serializer.WriteProperty(101, "value", val.value_.usmallint);
		break;
	case PhysicalType::UINT32:
		serializer.WriteProperty(101, "value", val.value_.uinteger);
		break;
	case PhysicalType::UINT64:
		serializer.WriteProperty(101, "value", val.value_.ubigint);
		break;
	case PhysicalType::INT128:
		serializer.WriteProperty(101, "value", val.value_.hugeint);
		break;
	case PhysicalType::UINT128:
		serializer.WriteProperty(101, "value", val.value_.uhugeint);
		break;
	case PhysicalType::FLOAT:
		serializer.WriteProperty(101, "value", val.value_.float_);
		break;
	case PhysicalType::DOUBLE:
		serializer.WriteProperty(101, "value", val.value_.double_);
		break;
	default:
		throw InternalException("Unsupported type for serializing numeric statistics");
	}
}